

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeWriteParameters(void *arkode_mem,FILE *fp)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  size_t sStack_20;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xb3d,"ARKodeWriteParameters",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    return -0x15;
  }
  fwrite("ARKODE solver parameters:\n",0x1a,1,(FILE *)fp);
  if ((*(double *)((long)arkode_mem + 0x2a8) != 0.0) || (NAN(*(double *)((long)arkode_mem + 0x2a8)))
     ) {
    fprintf((FILE *)fp,"  Minimum step size = %.16g\n");
  }
  dVar1 = *(double *)((long)arkode_mem + 0x2b0);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    fprintf((FILE *)fp,"  Maximum step size = %.16g\n",1.0 / dVar1);
  }
  if (*(int *)((long)arkode_mem + 0x2e0) != 0) {
    fwrite("  Fixed time-stepping enabled\n",0x1e,1,(FILE *)fp);
  }
  if (*(int *)((long)arkode_mem + 0x18) == 2) {
    pcVar3 = "  User provided error weight function\n";
    sStack_20 = 0x26;
  }
  else {
    fprintf((FILE *)fp,"  Solver relative tolerance = %.16g\n",
            *(undefined8 *)((long)arkode_mem + 0x20));
    if (*(int *)((long)arkode_mem + 0x18) == 0) {
      fprintf((FILE *)fp,"  Solver absolute tolerance = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x28));
      goto LAB_001350fd;
    }
    pcVar3 = "  Vector-valued solver absolute tolerance\n";
    sStack_20 = 0x2a;
  }
  fwrite(pcVar3,sStack_20,1,(FILE *)fp);
LAB_001350fd:
  if (*(int *)((long)arkode_mem + 0x220) == 0) {
    if (*(int *)((long)arkode_mem + 0x1c) == 0) {
      fprintf((FILE *)fp,"  Absolute residual tolerance = %.16g\n",
              *(undefined8 *)((long)arkode_mem + 0x40));
    }
    else {
      if (*(int *)((long)arkode_mem + 0x1c) == 2) {
        pcVar3 = "  User provided residual weight function\n";
        sStack_20 = 0x29;
      }
      else {
        pcVar3 = "  Vector-valued residual absolute tolerance\n";
        sStack_20 = 0x2c;
      }
      fwrite(pcVar3,sStack_20,1,(FILE *)fp);
    }
  }
  if ((*(double *)((long)arkode_mem + 0x298) != 0.0) || (NAN(*(double *)((long)arkode_mem + 0x298)))
     ) {
    fprintf((FILE *)fp,"  Initial step size = %.16g\n");
  }
  fputc(10,(FILE *)fp);
  fprintf((FILE *)fp,"  Maximum step increase (first step) = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 8));
  fprintf((FILE *)fp,"  Step reduction factor on multiple error fails = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x10));
  fprintf((FILE *)fp,"  Minimum error fails before above factor is used = %i\n",
          (ulong)*(uint *)(*(long *)((long)arkode_mem + 0x2e8) + 0x20));
  fprintf((FILE *)fp,"  Step reduction factor on nonlinear convergence failure = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x28));
  fprintf((FILE *)fp,"  Explicit safety factor = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x30));
  fprintf((FILE *)fp,"  Safety factor = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x38));
  fprintf((FILE *)fp,"  Growth factor = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x40));
  fprintf((FILE *)fp,"  Step growth lower bound = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x48));
  fprintf((FILE *)fp,"  Step growth upper bound = %.16g\n",
          *(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x50));
  if (*(code **)(*(long *)((long)arkode_mem + 0x2e8) + 0x78) == arkExpStab) {
    pcVar3 = "  Default explicit stability function\n";
    sStack_20 = 0x26;
  }
  else {
    pcVar3 = "  User provided explicit stability function\n";
    sStack_20 = 0x2c;
  }
  fwrite(pcVar3,sStack_20,1,(FILE *)fp);
  SUNAdaptController_Write(*(undefined8 *)(*(long *)((long)arkode_mem + 0x2e8) + 0x68),fp);
  fprintf((FILE *)fp,"  Maximum number of error test failures = %i\n",
          (ulong)*(uint *)((long)arkode_mem + 0x300));
  fprintf((FILE *)fp,"  Maximum number of convergence test failures = %i\n",
          (ulong)*(uint *)((long)arkode_mem + 0x304));
  if (*(code **)((long)arkode_mem + 0xb8) == (code *)0x0) {
    return 0;
  }
  iVar2 = (**(code **)((long)arkode_mem + 0xb8))(arkode_mem,fp);
  return iVar2;
}

Assistant:

int ARKodeWriteParameters(void* arkode_mem, FILE* fp)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* print integrator parameters to file */
  fprintf(fp, "ARKODE solver parameters:\n");
  if (ark_mem->hmin != ZERO)
  {
    fprintf(fp, "  Minimum step size = %" RSYM "\n", ark_mem->hmin);
  }
  if (ark_mem->hmax_inv != ZERO)
  {
    fprintf(fp, "  Maximum step size = %" RSYM "\n", ONE / ark_mem->hmax_inv);
  }
  if (ark_mem->fixedstep) { fprintf(fp, "  Fixed time-stepping enabled\n"); }
  if (ark_mem->itol == ARK_WF)
  {
    fprintf(fp, "  User provided error weight function\n");
  }
  else
  {
    fprintf(fp, "  Solver relative tolerance = %" RSYM "\n", ark_mem->reltol);
    if (ark_mem->itol == ARK_SS)
    {
      fprintf(fp, "  Solver absolute tolerance = %" RSYM "\n", ark_mem->Sabstol);
    }
    else { fprintf(fp, "  Vector-valued solver absolute tolerance\n"); }
  }
  if (!ark_mem->rwt_is_ewt)
  {
    if (ark_mem->ritol == ARK_WF)
    {
      fprintf(fp, "  User provided residual weight function\n");
    }
    else
    {
      if (ark_mem->ritol == ARK_SS)
      {
        fprintf(fp, "  Absolute residual tolerance = %" RSYM "\n",
                ark_mem->SRabstol);
      }
      else { fprintf(fp, "  Vector-valued residual absolute tolerance\n"); }
    }
  }
  if (ark_mem->hin != ZERO)
  {
    fprintf(fp, "  Initial step size = %" RSYM "\n", ark_mem->hin);
  }
  fprintf(fp, "\n");
  fprintf(fp, "  Maximum step increase (first step) = %" RSYM "\n",
          ark_mem->hadapt_mem->etamx1);
  fprintf(fp, "  Step reduction factor on multiple error fails = %" RSYM "\n",
          ark_mem->hadapt_mem->etamxf);
  fprintf(fp, "  Minimum error fails before above factor is used = %i\n",
          ark_mem->hadapt_mem->small_nef);
  fprintf(fp,
          "  Step reduction factor on nonlinear convergence failure = %" RSYM
          "\n",
          ark_mem->hadapt_mem->etacf);
  fprintf(fp, "  Explicit safety factor = %" RSYM "\n", ark_mem->hadapt_mem->cfl);
  fprintf(fp, "  Safety factor = %" RSYM "\n", ark_mem->hadapt_mem->safety);
  fprintf(fp, "  Growth factor = %" RSYM "\n", ark_mem->hadapt_mem->growth);
  fprintf(fp, "  Step growth lower bound = %" RSYM "\n",
          ark_mem->hadapt_mem->lbound);
  fprintf(fp, "  Step growth upper bound = %" RSYM "\n",
          ark_mem->hadapt_mem->ubound);
  if (ark_mem->hadapt_mem->expstab == arkExpStab)
  {
    fprintf(fp, "  Default explicit stability function\n");
  }
  else { fprintf(fp, "  User provided explicit stability function\n"); }
  (void)SUNAdaptController_Write(ark_mem->hadapt_mem->hcontroller, fp);

  fprintf(fp, "  Maximum number of error test failures = %i\n", ark_mem->maxnef);
  fprintf(fp, "  Maximum number of convergence test failures = %i\n",
          ark_mem->maxncf);

  /* Call stepper routine (if provided) */
  if (ark_mem->step_writeparameters)
  {
    return (ark_mem->step_writeparameters(ark_mem, fp));
  }

  return (ARK_SUCCESS);
}